

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar1;
  
  pVVar1 = UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this);
  if (this->arena_ != (Arena *)0x0) {
    pVVar1 = copy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pVVar1)
    ;
    return pVVar1;
  }
  return pVVar1;
}

Assistant:

[[nodiscard]] Value<TypeHandler>* ReleaseLast() {
    Value<TypeHandler>* result = UnsafeArenaReleaseLast<TypeHandler>();
    // Now perform a copy if we're on an arena.
    Arena* arena = GetArena();

    if (internal::DebugHardenForceCopyInRelease()) {
      auto* new_result = copy<TypeHandler>(result);
      if (arena == nullptr) delete result;
      return new_result;
    } else {
      return (arena == nullptr) ? result : copy<TypeHandler>(result);
    }
  }